

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void x11_keyboard_handle_key(XEvent *event)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  
  lVar2 = XLookupKeysym(event,0);
  if (lVar2 < 0xff51) {
    if (lVar2 == 0x20) {
      uVar1 = (uint)(animate == 0);
      if (animate == 0) {
        animate = uVar1;
        redisplay = 0;
        return;
      }
      animate = uVar1;
      redisplay = 1;
      return;
    }
    if (lVar2 != 0x74) {
      if (lVar2 == 0xff1b) {
        sighandler((int)event);
        return;
      }
      return;
    }
    pcVar3 = getenv("NO_TEXTURE");
    if (pcVar3 == (char *)0x0) {
      setenv("NO_TEXTURE","1",1);
    }
    else {
      unsetenv("NO_TEXTURE");
    }
  }
  else {
    switch(lVar2) {
    case 0xff51:
      view_ry = view_ry + 5.0;
      break;
    case 0xff52:
      view_rx = view_rx + 5.0;
      break;
    case 0xff53:
      view_ry = view_ry + -5.0;
      break;
    case 0xff54:
      view_rx = view_rx + -5.0;
      break;
    case 0xff55:
      view_tz = view_tz + -5.0;
      break;
    case 0xff56:
      view_tz = view_tz + 5.0;
      break;
    default:
      return;
    }
  }
  if (animate == 0) {
    redisplay = 0;
    return;
  }
  return;
}

Assistant:

static void x11_keyboard_handle_key(XEvent *event)
{
  switch (XLookupKeysym(&event->xkey, 0)) {
    case XK_Escape:
      sighandler(SIGTERM);
      return;
    case XK_space:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case XK_Page_Down:
      view_tz -= -5.0;
      break;
    case XK_Page_Up:
      view_tz += -5.0;
      break;
    case XK_Down:
      view_rx -= 5.0;
      break;
    case XK_Up:
      view_rx += 5.0;
      break;
    case XK_Right:
      view_ry -= 5.0;
      break;
    case XK_Left:
      view_ry += 5.0;
      break;
    case XK_t:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}